

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::setupTags(TranslateToFuzzReader *this)

{
  long *plVar1;
  long lVar2;
  Module *pMVar3;
  uint32_t uVar4;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  long *plVar5;
  ulong uVar6;
  bool bVar7;
  Signature SVar8;
  Name NVar9;
  Name name;
  Name name_00;
  string_view local_80;
  HeapType local_70;
  string_view local_68;
  Type local_58;
  Type externref;
  Name local_48;
  __uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_> local_38;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> wasmTag;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> jsTag;
  
  plVar1 = *(long **)(this->wasm + 0x50);
  for (plVar5 = *(long **)(this->wasm + 0x48); plVar5 != plVar1; plVar5 = plVar5 + 1) {
    lVar2 = *plVar5;
    if ((*(long *)(lVar2 + 0x20) != 0) && (this->preserveImportsAndExports == false)) {
      *(undefined8 *)(lVar2 + 0x28) = 0;
      *(undefined8 *)(lVar2 + 0x30) = 0;
      lVar2 = *plVar5;
      *(undefined8 *)(lVar2 + 0x18) = 0;
      *(undefined8 *)(lVar2 + 0x20) = 0;
    }
  }
  uVar4 = Random::upTo(&this->random,3);
  uVar6 = (ulong)uVar4;
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    addTag(this);
  }
  if (this->preserveImportsAndExports == false) {
    bVar7 = Random::oneIn(&this->random,2);
    if (bVar7) {
      pMVar3 = this->wasm;
      Name::Name((Name *)&local_80,"wasmtag");
      NVar9 = Names::getValidTagName(pMVar3,(Name)local_80);
      wasm::HeapType::HeapType(&local_70,(Signature)ZEXT816(2));
      name.super_IString.str._M_str = NVar9.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeTag(name,(HeapType)NVar9.super_IString.str._M_str);
      Name::Name(&local_48,"fuzzing-support");
      (((Name *)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18))->
      super_IString).str._M_len = local_48.super_IString.str._M_len;
      *(char **)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x20) =
           local_48.super_IString.str._M_str;
      Name::Name(&local_48,"wasmtag");
      (((Name *)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28))->
      super_IString).str._M_len = local_48.super_IString.str._M_len;
      *(char **)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x30) =
           local_48.super_IString.str._M_str;
      wasm::Module::addTag((unique_ptr *)this->wasm);
      Type::Type(&local_58,(HeapType)0x8,Nullable,Inexact);
      pMVar3 = this->wasm;
      Name::Name((Name *)&local_68,"jstag");
      NVar9 = Names::getValidTagName(pMVar3,(Name)local_68);
      SVar8.results.id = 0;
      SVar8.params.id = local_58.id;
      wasm::HeapType::HeapType((HeapType *)&externref,SVar8);
      name_00.super_IString.str._M_str = NVar9.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)&wasmTag;
      Builder::makeTag(name_00,(HeapType)NVar9.super_IString.str._M_str);
      Name::Name(&local_48,"fuzzing-support");
      *(size_t *)
       ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) =
           local_48.super_IString.str._M_len;
      *(char **)((long)wasmTag._M_t.
                       super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x20) =
           local_48.super_IString.str._M_str;
      Name::Name(&local_48,"jstag");
      *(size_t *)
       ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28) =
           local_48.super_IString.str._M_len;
      *(char **)((long)wasmTag._M_t.
                       super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x30) =
           local_48.super_IString.str._M_str;
      wasm::Module::addTag((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&wasmTag);
      std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
                ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTags() {
  // As in modifyInitialFunctions(), we can't allow arbitrary tag imports, which
  // would trap when the fuzzing infrastructure doesn't know what to provide.
  for (auto& tag : wasm.tags) {
    if (tag->imported() && !preserveImportsAndExports) {
      tag->module = tag->base = Name();
    }
  }

  // Add some random tags.
  Index num = upTo(3);
  for (size_t i = 0; i < num; i++) {
    addTag();
  }

  // Add the fuzzing support tags manually sometimes.
  if (!preserveImportsAndExports && oneIn(2)) {
    auto wasmTag = builder.makeTag(Names::getValidTagName(wasm, "wasmtag"),
                                   Signature(Type::i32, Type::none));
    wasmTag->module = "fuzzing-support";
    wasmTag->base = "wasmtag";
    wasm.addTag(std::move(wasmTag));

    auto externref = Type(HeapType::ext, Nullable);
    auto jsTag = builder.makeTag(Names::getValidTagName(wasm, "jstag"),
                                 Signature(externref, Type::none));
    jsTag->module = "fuzzing-support";
    jsTag->base = "jstag";
    wasm.addTag(std::move(jsTag));
  }
}